

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_increase_indent(yaml_emitter_t *emitter,int flow,int indentless)

{
  int *piVar1;
  int iVar2;
  int local_24;
  int indentless_local;
  int flow_local;
  yaml_emitter_t *emitter_local;
  
  if (((emitter->indents).top == (emitter->indents).end) &&
     (iVar2 = yaml_stack_extend(&(emitter->indents).start,&(emitter->indents).top,
                                &(emitter->indents).end), iVar2 == 0)) {
    emitter->error = YAML_MEMORY_ERROR;
    emitter_local._4_4_ = 0;
  }
  else {
    iVar2 = emitter->indent;
    piVar1 = (emitter->indents).top;
    (emitter->indents).top = piVar1 + 1;
    *piVar1 = iVar2;
    if (emitter->indent < 0) {
      if (flow == 0) {
        local_24 = 0;
      }
      else {
        local_24 = emitter->best_indent;
      }
      emitter->indent = local_24;
    }
    else if (indentless == 0) {
      emitter->indent = emitter->best_indent + emitter->indent;
    }
    emitter_local._4_4_ = 1;
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_increase_indent(yaml_emitter_t *emitter,
        int flow, int indentless)
{
    if (!PUSH(emitter, emitter->indents, emitter->indent))
        return 0;

    if (emitter->indent < 0) {
        emitter->indent = flow ? emitter->best_indent : 0;
    }
    else if (!indentless) {
        emitter->indent += emitter->best_indent;
    }

    return 1;
}